

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addProgramOperations(GLES2ThreadedSharingTest *this)

{
  EGLThread *pEVar1;
  pointer ppEVar2;
  int iVar3;
  CreateShader *pCVar4;
  ShaderSource *pSVar5;
  ShaderCompile *pSVar6;
  CreateProgram *this_00;
  AttachShader *pAVar7;
  LinkProgram *pLVar8;
  DetachShader *pDVar9;
  DeleteProgram *pDVar10;
  DeleteShader *pDVar11;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> *pSVar12;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_190;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_180;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_170;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_160;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_150;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_140;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_130;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_120;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_110;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_100;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_f0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_d0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_c0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_b0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_a0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_90;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_80;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_70;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_40;
  
  vertexShader.m_ptr = (Shader *)0x0;
  vertexShader.m_state = (SharedPtrStateBase *)0x0;
  fragmentShader.m_ptr = (Shader *)0x0;
  fragmentShader.m_state = (SharedPtrStateBase *)0x0;
  if ((this->m_config).define != 0) {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar4 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar4,0x8b31,&vertexShader,(this->m_config).useFenceSync,(this->m_config).serverSync
              );
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar4);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (ShaderSource *)operator_new(0x98);
    local_e0.m_ptr = vertexShader.m_ptr;
    local_e0.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar5,&local_e0,
               "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_e0);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = (ShaderCompile *)operator_new(0x78);
    local_f0.m_ptr = vertexShader.m_ptr;
    local_f0.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar6,&local_f0,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_f0);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar4 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar4,0x8b30,&fragmentShader,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar4);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (ShaderSource *)operator_new(0x98);
    local_100.m_ptr = fragmentShader.m_ptr;
    local_100.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar5,&local_100,
               "varying mediump vec2 v_pos;\nvoid main(void)\n{\n\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_100);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = (ShaderCompile *)operator_new(0x78);
    local_110.m_ptr = fragmentShader.m_ptr;
    local_110.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar6,&local_110,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_110);
  }
  program.m_ptr = (Program *)0x0;
  program.m_state = (SharedPtrStateBase *)0x0;
  pEVar1 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (CreateProgram *)operator_new(0x78);
  GLES2ThreadTest::CreateProgram::CreateProgram
            (this_00,&program,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_00);
  if ((this->m_config).define != 0) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar1 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pAVar7 = (AttachShader *)operator_new(0x88);
      local_140.m_ptr = program.m_ptr;
      local_140.m_state = program.m_state;
      if (program.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_150.m_ptr = vertexShader.m_ptr;
      local_150.m_state = vertexShader.m_state;
      if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar7,&local_140,&local_150,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar7);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_150);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_140);
      pEVar1 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pAVar7 = (AttachShader *)operator_new(0x88);
      local_60.m_ptr = program.m_ptr;
      local_60.m_state = program.m_state;
      if (program.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_70.m_ptr = fragmentShader.m_ptr;
      local_70.m_state = fragmentShader.m_state;
      if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar12 = &local_60;
      shader = &local_70;
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar7,pSVar12,shader,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar7);
    }
    else {
      pEVar1 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar7 = (AttachShader *)operator_new(0x88);
      local_120.m_ptr = program.m_ptr;
      local_120.m_state = program.m_state;
      if (program.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_130.m_ptr = vertexShader.m_ptr;
      local_130.m_state = vertexShader.m_state;
      if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar7,&local_120,&local_130,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar7);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_130);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_120);
      pEVar1 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar7 = (AttachShader *)operator_new(0x88);
      local_40.m_ptr = program.m_ptr;
      local_40.m_state = program.m_state;
      if (program.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_50.m_ptr = fragmentShader.m_ptr;
      local_50.m_state = fragmentShader.m_state;
      if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar12 = &local_40;
      shader = &local_50;
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar7,pSVar12,shader,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar7);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(shader);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(pSVar12);
  }
  iVar3 = (this->m_config).modify;
  if (iVar3 == 1) {
    ppEVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar1 = *ppEVar2;
      pLVar8 = (LinkProgram *)operator_new(0x78);
      local_80.m_ptr = program.m_ptr;
      local_80.m_state = program.m_state;
      if (program.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar12 = &local_80;
      GLES2ThreadTest::LinkProgram::LinkProgram
                (pLVar8,pSVar12,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pLVar8);
    }
    else {
      pEVar1 = ppEVar2[1];
      pLVar8 = (LinkProgram *)operator_new(0x78);
      local_90.m_ptr = program.m_ptr;
      local_90.m_state = program.m_state;
      if (program.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar12 = &local_90;
      GLES2ThreadTest::LinkProgram::LinkProgram
                (pLVar8,pSVar12,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pLVar8);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(pSVar12);
    iVar3 = (this->m_config).modify;
  }
  if (iVar3 == 2) {
    ppEVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar1 = *ppEVar2;
      pDVar9 = (DetachShader *)operator_new(0x80);
      local_160.m_ptr = program.m_ptr;
      local_160.m_state = program.m_state;
      if (program.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar9,&local_160,0x8b31,(this->m_config).useFenceSync,(this->m_config).serverSync)
      ;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar9);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_160);
      pEVar1 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar9 = (DetachShader *)operator_new(0x80);
      local_a0.m_ptr = program.m_ptr;
      local_a0.m_state = program.m_state;
      if (program.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar12 = &local_a0;
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar9,pSVar12,0x8b30,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar9);
    }
    else {
      pEVar1 = ppEVar2[1];
      pDVar9 = (DetachShader *)operator_new(0x80);
      local_170.m_ptr = program.m_ptr;
      local_170.m_state = program.m_state;
      if (program.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar9,&local_170,0x8b31,(this->m_config).useFenceSync,(this->m_config).serverSync)
      ;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar9);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_170);
      pEVar1 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pDVar9 = (DetachShader *)operator_new(0x80);
      local_b0.m_ptr = program.m_ptr;
      local_b0.m_state = program.m_state;
      if (program.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar12 = &local_b0;
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar9,pSVar12,0x8b30,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar9);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(pSVar12);
  }
  if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
    pEVar1 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pDVar10 = (DeleteProgram *)operator_new(0x78);
    local_d0.m_ptr = program.m_ptr;
    local_d0.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    pSVar12 = &local_d0;
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (pDVar10,pSVar12,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar10);
  }
  else {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar10 = (DeleteProgram *)operator_new(0x78);
    local_c0.m_ptr = program.m_ptr;
    local_c0.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    pSVar12 = &local_c0;
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (pDVar10,pSVar12,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar10);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(pSVar12);
  if ((this->m_config).render == true) {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar11 = (DeleteShader *)operator_new(0x78);
    local_180.m_ptr = vertexShader.m_ptr;
    local_180.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar11,&local_180,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar11);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_180);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar11 = (DeleteShader *)operator_new(0x78);
    local_190.m_ptr = fragmentShader.m_ptr;
    local_190.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar11,&local_190,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar11);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_190);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&program);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&fragmentShader);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&vertexShader);
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addProgramOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;

	if (m_config.define)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Program> program;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define)
	{
		// Attach shaders
		if (m_config.modify || m_config.render)
		{
			m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));
			m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		}
		else
		{
			m_threads[1]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));
			m_threads[1]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		}
	}

	if (m_config.modify == 1)
	{
		// Link program
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 2)
	{
		// Link program
		if (m_config.render)
		{
			m_threads[0]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_VERTEX_SHADER, m_config.useFenceSync, m_config.serverSync));
			m_threads[0]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_FRAGMENT_SHADER, m_config.useFenceSync, m_config.serverSync));
		}
		else
		{
			m_threads[1]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_VERTEX_SHADER, m_config.useFenceSync, m_config.serverSync));
			m_threads[1]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_FRAGMENT_SHADER, m_config.useFenceSync, m_config.serverSync));
		}
	}

	if (m_config.render)
	{
		DE_ASSERT(false);
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
	}
}